

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Get_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_UInt axis_count;
  PS_Blend pPVar1;
  ulong uVar2;
  ulong uVar3;
  FT_Fixed local_48;
  FT_Fixed axiscoords [4];
  
  pPVar1 = face->blend;
  if (pPVar1 != (PS_Blend)0x0) {
    axis_count = pPVar1->num_axis;
    mm_weights_unmap(pPVar1->weight_vector,&local_48,axis_count);
    if (num_coords <= axis_count) {
      axis_count = num_coords;
    }
    uVar3 = (ulong)axis_count;
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      coords[uVar2] = axiscoords[uVar2 - 1];
    }
    for (; (num_coords - axis_count) + (int)uVar2 != uVar3; uVar3 = uVar3 + 1) {
      coords[uVar3] = 0x8000;
    }
    return 0;
  }
  return 6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_MM_Blend: only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = axiscoords[i];
    for ( ; i < num_coords; i++ )
      coords[i] = 0x8000;

    return FT_Err_Ok;
  }